

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.pb.cc
# Opt level: O2

char * __thiscall google::protobuf::Any::_InternalParse(Any *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  void *pvVar1;
  bool bVar2;
  string *psVar3;
  char cVar4;
  UnknownFieldSet *unknown;
  ulong tag_00;
  uint local_3c;
  char *pcStack_38;
  uint32 tag;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pcStack_38 = ptr;
  do {
    bVar2 = internal::ParseContext::Done(ctx,&stack0xffffffffffffffc8);
    if (bVar2) {
      return pcStack_38;
    }
    pcStack_38 = internal::ReadTag(pcStack_38,&local_3c,0);
    if (pcStack_38 == (char *)0x0) {
      return (char *)0x0;
    }
    tag_00 = (ulong)local_3c;
    if (local_3c >> 3 == 2) {
      if ((char)local_3c != '\x12') goto LAB_00296805;
      psVar3 = _internal_mutable_value_abi_cxx11_(this);
      pcStack_38 = internal::InlineGreedyStringParser(psVar3,pcStack_38,ctx);
LAB_00296838:
      cVar4 = '\x02';
      if (pcStack_38 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    else {
      if ((local_3c >> 3 != 1) || ((char)local_3c != '\n')) {
LAB_00296805:
        if ((tag_00 == 0) || ((local_3c & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
          return pcStack_38;
        }
        pvVar1 = this_00->ptr_;
        if (((ulong)pvVar1 & 1) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
        }
        else {
          unknown = (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8);
        }
        pcStack_38 = internal::UnknownFieldParse(tag_00,unknown,pcStack_38,ctx);
        goto LAB_00296838;
      }
      psVar3 = _internal_mutable_type_url_abi_cxx11_(this);
      pcStack_38 = internal::InlineGreedyStringParser(psVar3,pcStack_38,ctx);
      bVar2 = internal::VerifyUTF8(psVar3,"google.protobuf.Any.type_url");
      if (!bVar2) {
        return (char *)0x0;
      }
      cVar4 = (pcStack_38 == (char *)0x0) * '\x02' + '\x02';
    }
    if (cVar4 != '\x02') {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Any::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // string type_url = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_type_url();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Any.type_url"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // bytes value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          auto str = _internal_mutable_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}